

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

pair<unsigned_long,_bool> __thiscall CConnman::SocketSendData(CConnman *this,CNode *node)

{
  rep rVar1;
  pointer puVar2;
  pointer puVar3;
  _Head_base<0UL,_Transport_*,_false> _Var4;
  element_type *peVar5;
  size_t sVar6;
  iterator __first;
  iterator __last;
  _Elt_pointer __k;
  bool bVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  time_point tVar12;
  mapped_type_conflict5 *pmVar13;
  uint *puVar14;
  Logger *this_00;
  undefined4 extraout_var;
  char cVar15;
  _Elt_pointer pCVar16;
  long in_FS_OFFSET;
  pair<unsigned_long,_bool> pVar17;
  string_view source_file;
  string_view logging_function;
  undefined8 in_stack_ffffffffffffff28;
  _Map_pointer ppCVar18;
  _Elt_pointer pCVar19;
  _Map_pointer ppCVar20;
  mapMsgTypeSize *this_01;
  Mutex *pMVar21;
  _Map_pointer ppCVar22;
  iterator local_98;
  _Elt_pointer local_78;
  CSerializedNetMsg *local_70;
  CSerializedNetMsg *local_68;
  _Map_pointer local_60;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock57;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  _Map_pointer ppCVar11;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar16 = (node->vSendMsg).
            super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  pCVar19 = (node->vSendMsg).
            super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  ppCVar18 = (node->vSendMsg).
             super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  pMVar21 = &node->m_sock_mutex;
  this_01 = &node->mapSendBytesPerMsgType;
  ppCVar20 = (_Map_pointer)0x0;
  do {
    if (pCVar16 !=
        (node->vSendMsg).super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur) {
      puVar2 = (pCVar16->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar3 = (pCVar16->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      _Var4._M_head_impl =
           (node->m_transport)._M_t.
           super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
           super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
           super__Head_base<0UL,_Transport_*,_false>._M_head_impl;
      iVar8 = (*(_Var4._M_head_impl)->_vptr_Transport[6])(_Var4._M_head_impl,pCVar16);
      if ((char)iVar8 != '\0') {
        lVar10 = ((ulong)(puVar3 + (0x1f - (long)puVar2)) & 0xfffffffffffffff0) + 0x38;
        if (puVar3 == puVar2) {
          lVar10 = 0x38;
        }
        node->m_send_memusage = node->m_send_memusage - lVar10;
        pCVar16 = pCVar16 + 1;
        if (pCVar16 == pCVar19) {
          pCVar16 = ppCVar18[1];
          ppCVar18 = ppCVar18 + 1;
          pCVar19 = pCVar16 + 9;
        }
      }
    }
    _Var4._M_head_impl =
         (node->m_transport)._M_t.super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>.
         _M_t.super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
         super__Head_base<0UL,_Transport_*,_false>._M_head_impl;
    (*(_Var4._M_head_impl)->_vptr_Transport[7])
              (&local_78,_Var4._M_head_impl,
               (ulong)(pCVar16 !=
                      (node->vSendMsg).
                      super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>.
                      _M_impl.super__Deque_impl_data._M_finish._M_cur));
    __k = local_78;
    ppCVar22 = local_60;
    if (local_60 == (_Map_pointer)0x0) {
      ppCVar11 = (_Map_pointer)0x0;
LAB_008cd669:
      if ((int)ppCVar11 < 1) {
        cVar15 = '\x03';
        if ((int)ppCVar11 < 0) {
          puVar14 = (uint *)__errno_location();
          uVar9 = *puVar14;
          ppCVar11 = (_Map_pointer)(ulong)uVar9;
          if ((int)uVar9 < 0x5a) {
            if ((uVar9 != 4) && (uVar9 != 0xb)) {
LAB_008cd708:
              this_00 = LogInstance();
              bVar7 = BCLog::Logger::WillLogCategoryLevel(this_00,NET,Debug);
              if (bVar7) {
                local_98._M_cur = (_Elt_pointer)node->id;
                NetworkErrorString_abi_cxx11_((string *)&criticalblock57,uVar9);
                source_file._M_str =
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                ;
                source_file._M_len = 0x57;
                logging_function._M_str = "SocketSendData";
                logging_function._M_len = 0xe;
                LogPrintFormatInternal<long,std::__cxx11::string>
                          (logging_function,source_file,0x661,NET,Debug,
                           (ConstevalFormatString<2U>)0xf9b813,(long *)&local_98,
                           (string *)&criticalblock57);
                if (criticalblock57.super_unique_lock._M_device !=
                    (mutex_type *)&stack0xffffffffffffffb8) {
                  operator_delete(criticalblock57.super_unique_lock._M_device,local_48 + 1);
                }
              }
              CNode::CloseSocketDisconnect(node);
            }
          }
          else if ((uVar9 != 0x5a) && (uVar9 != 0x73)) goto LAB_008cd708;
        }
      }
      else {
        tVar12 = NodeClock::now();
        LOCK();
        rVar1 = (node->m_last_send)._M_i.__r;
        (node->m_last_send)._M_i.__r = (long)tVar12.__d.__r / 1000000000;
        UNLOCK();
        node->nSendBytes = node->nSendBytes + (long)ppCVar11;
        _Var4._M_head_impl =
             (node->m_transport)._M_t.
             super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
             super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
             super__Head_base<0UL,_Transport_*,_false>._M_head_impl;
        (*(_Var4._M_head_impl)->_vptr_Transport[8])(_Var4._M_head_impl,ppCVar11,rVar1);
        if ((__k->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          pmVar13 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    ::operator[](this_01,(key_type *)__k);
          *pmVar13 = *pmVar13 + (long)ppCVar11;
        }
        ppCVar20 = (_Map_pointer)((long)ppCVar20 + (long)ppCVar11);
        cVar15 = (local_60 != ppCVar11) * '\x03';
      }
    }
    else {
      criticalblock57.super_unique_lock._8_8_ =
           criticalblock57.super_unique_lock._8_8_ & 0xffffffffffffff00;
      criticalblock57.super_unique_lock._M_device = &pMVar21->super_mutex;
      std::unique_lock<std::mutex>::lock(&criticalblock57.super_unique_lock);
      peVar5 = (node->m_sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar5 == (element_type *)0x0) {
        ppCVar11 = (_Map_pointer)0x0;
        cVar15 = '\x03';
      }
      else {
        uVar9 = (*peVar5->_vptr_Sock[3])
                          (peVar5,local_68,local_60,(ulong)((uint)(byte)local_70 << 0xf | 0x4040));
        ppCVar11 = (_Map_pointer)(ulong)uVar9;
        cVar15 = '\0';
      }
      std::unique_lock<std::mutex>::~unique_lock(&criticalblock57.super_unique_lock);
      if (peVar5 != (element_type *)0x0) goto LAB_008cd669;
    }
    if (cVar15 != '\0') {
      sVar6 = node->m_send_memusage;
      iVar8 = (*((node->m_transport)._M_t.
                 super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
                 super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
                 super__Head_base<0UL,_Transport_*,_false>._M_head_impl)->_vptr_Transport[9])();
      LOCK();
      (node->fPauseSend)._M_base._M_i =
           (ulong)this->nSendBufferMaxSize < CONCAT44(extraout_var,iVar8) + sVar6;
      UNLOCK();
      if ((pCVar16 ==
           (node->vSendMsg).super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur) && (node->m_send_memusage != 0)) {
        __assert_fail("node.m_send_memusage == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                      ,0x66c,"std::pair<size_t, bool> CConnman::SocketSendData(CNode &) const");
      }
      pVar17._9_7_ = (int7)((ulong)ppCVar11 >> 8);
      pVar17.second = ppCVar22 != (_Map_pointer)0x0;
      local_78 = (node->vSendMsg).
                 super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur;
      local_60 = (node->vSendMsg).
                 super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
                 super__Deque_impl_data._M_start._M_node;
      local_70 = *local_60;
      local_68 = local_70 + 9;
      criticalblock57.super_unique_lock._8_8_ = *ppCVar18;
      local_48 = criticalblock57.super_unique_lock._8_8_ + 0x1f8;
      __first._M_first = (_Elt_pointer)ppCVar18;
      __first._M_cur = (_Elt_pointer)in_stack_ffffffffffffff28;
      __first._M_last = pCVar19;
      __first._M_node = ppCVar20;
      __last._M_first = (_Elt_pointer)this_01;
      __last._M_cur = (_Elt_pointer)this;
      __last._M_last = (_Elt_pointer)pMVar21;
      __last._M_node = ppCVar22;
      criticalblock57.super_unique_lock._M_device = (mutex_type *)pCVar16;
      local_40 = ppCVar18;
      std::deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::_M_erase
                (&local_98,&node->vSendMsg,__first,__last);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      pVar17.first = (unsigned_long)ppCVar20;
      return pVar17;
    }
  } while( true );
}

Assistant:

std::pair<size_t, bool> CConnman::SocketSendData(CNode& node) const
{
    auto it = node.vSendMsg.begin();
    size_t nSentSize = 0;
    bool data_left{false}; //!< second return value (whether unsent data remains)
    std::optional<bool> expected_more;

    while (true) {
        if (it != node.vSendMsg.end()) {
            // If possible, move one message from the send queue to the transport. This fails when
            // there is an existing message still being sent, or (for v2 transports) when the
            // handshake has not yet completed.
            size_t memusage = it->GetMemoryUsage();
            if (node.m_transport->SetMessageToSend(*it)) {
                // Update memory usage of send buffer (as *it will be deleted).
                node.m_send_memusage -= memusage;
                ++it;
            }
        }
        const auto& [data, more, msg_type] = node.m_transport->GetBytesToSend(it != node.vSendMsg.end());
        // We rely on the 'more' value returned by GetBytesToSend to correctly predict whether more
        // bytes are still to be sent, to correctly set the MSG_MORE flag. As a sanity check,
        // verify that the previously returned 'more' was correct.
        if (expected_more.has_value()) Assume(!data.empty() == *expected_more);
        expected_more = more;
        data_left = !data.empty(); // will be overwritten on next loop if all of data gets sent
        int nBytes = 0;
        if (!data.empty()) {
            LOCK(node.m_sock_mutex);
            // There is no socket in case we've already disconnected, or in test cases without
            // real connections. In these cases, we bail out immediately and just leave things
            // in the send queue and transport.
            if (!node.m_sock) {
                break;
            }
            int flags = MSG_NOSIGNAL | MSG_DONTWAIT;
#ifdef MSG_MORE
            if (more) {
                flags |= MSG_MORE;
            }
#endif
            nBytes = node.m_sock->Send(reinterpret_cast<const char*>(data.data()), data.size(), flags);
        }
        if (nBytes > 0) {
            node.m_last_send = GetTime<std::chrono::seconds>();
            node.nSendBytes += nBytes;
            // Notify transport that bytes have been processed.
            node.m_transport->MarkBytesSent(nBytes);
            // Update statistics per message type.
            if (!msg_type.empty()) { // don't report v2 handshake bytes for now
                node.AccountForSentBytes(msg_type, nBytes);
            }
            nSentSize += nBytes;
            if ((size_t)nBytes != data.size()) {
                // could not send full message; stop sending more
                break;
            }
        } else {
            if (nBytes < 0) {
                // error
                int nErr = WSAGetLastError();
                if (nErr != WSAEWOULDBLOCK && nErr != WSAEMSGSIZE && nErr != WSAEINTR && nErr != WSAEINPROGRESS) {
                    LogDebug(BCLog::NET, "socket send error for peer=%d: %s\n", node.GetId(), NetworkErrorString(nErr));
                    node.CloseSocketDisconnect();
                }
            }
            break;
        }
    }

    node.fPauseSend = node.m_send_memusage + node.m_transport->GetSendMemoryUsage() > nSendBufferMaxSize;

    if (it == node.vSendMsg.end()) {
        assert(node.m_send_memusage == 0);
    }
    node.vSendMsg.erase(node.vSendMsg.begin(), it);
    return {nSentSize, data_left};
}